

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::SerializeWithCachedSizes
          (ImageFeatureType_ImageSize *this,CodedOutputStream *output)

{
  uint64 uVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ImageFeatureType_ImageSize *this_local;
  
  uVar1 = width(this);
  if (uVar1 != 0) {
    uVar1 = width(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  uVar1 = height(this);
  if (uVar1 != 0) {
    uVar1 = height(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar1,output);
  }
  return;
}

Assistant:

void ImageFeatureType_ImageSize::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ImageFeatureType.ImageSize)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 width = 1;
  if (this->width() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->width(), output);
  }

  // uint64 height = 2;
  if (this->height() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->height(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ImageFeatureType.ImageSize)
}